

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_cle_u_w_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  uVar7 = pfVar1->fs[1];
  uVar8 = pfVar1->fs[2];
  uVar9 = pfVar1->fs[3];
  pfVar2 = (env->active_fpu).fpr + wt;
  uVar4 = pfVar2->fs[1];
  uVar5 = pfVar2->fs[2];
  uVar6 = pfVar2->fs[3];
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fs[0] =
       -(uint)((int)(pfVar2->fs[0] ^ 0x80000000) < (int)(pfVar1->fs[0] ^ 0x80000000)) ^ 0xffffffff;
  pfVar3->fs[1] = -(uint)((int)(uVar4 ^ 0x80000000) < (int)(uVar7 ^ 0x80000000)) ^ 0xffffffff;
  pfVar3->fs[2] = -(uint)((int)(uVar5 ^ 0x80000000) < (int)(uVar8 ^ 0x80000000)) ^ 0xffffffff;
  pfVar3->fs[3] = -(uint)((int)(uVar6 ^ 0x80000000) < (int)(uVar9 ^ 0x80000000)) ^ 0xffffffff;
  return;
}

Assistant:

void helper_msa_cle_u_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_cle_u_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_cle_u_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_cle_u_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_cle_u_df(DF_WORD, pws->w[3],  pwt->w[3]);
}